

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops.cpp
# Opt level: O3

void ggml_compute_forward_argsort(ggml_compute_params *params,ggml_tensor *dst)

{
  undefined1 auVar1 [64];
  int iVar2;
  int iVar3;
  ggml_tensor *pgVar4;
  size_t sVar5;
  size_t sVar6;
  long lVar7;
  void *pvVar8;
  void *pvVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  int64_t i;
  long lVar15;
  void *pvVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  void *pvVar21;
  int32_t tmp;
  int iVar22;
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  
  pgVar4 = dst->src[0];
  if (pgVar4->type != GGML_TYPE_F32) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1ac3,"fatal error");
  }
  if (dst->nb[0] != 4) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-cpu/ops.cpp"
               ,0x1a97,"GGML_ASSERT(%s) failed","nb0 == sizeof(float)");
  }
  sVar5 = pgVar4->nb[1];
  sVar6 = dst->nb[1];
  iVar2 = params->nth;
  lVar15 = (long)params->ith;
  lVar7 = dst->ne[0];
  lVar10 = ggml_nrows(pgVar4);
  if (lVar15 < lVar10) {
    pvVar8 = pgVar4->data;
    auVar23 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar24 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar25 = vpmovsxbd_avx512f(_DAT_0014b380);
    auVar26 = vpbroadcastq_avx512f(ZEXT816(0x10));
    auVar27 = vpbroadcastd_avx512f(ZEXT416(0x10));
    pvVar9 = dst->data;
    iVar3 = dst->op_params[0];
    auVar28 = vpbroadcastq_avx512f();
    pvVar16 = (void *)(sVar6 * lVar15 + (long)pvVar9);
    do {
      if (0 < lVar7) {
        lVar18 = lVar15 * sVar6;
        lVar19 = lVar15 * sVar5;
        uVar11 = 0;
        auVar29 = vmovdqa64_avx512f(auVar24);
        auVar30 = vmovdqa64_avx512f(auVar23);
        auVar31 = vmovdqa64_avx512f(auVar25);
        do {
          vpcmpuq_avx512f(auVar29,auVar28,2);
          vpcmpuq_avx512f(auVar30,auVar28,2);
          auVar29 = vpaddq_avx512f(auVar29,auVar26);
          auVar30 = vpaddq_avx512f(auVar30,auVar26);
          auVar1 = vmovdqu32_avx512f(auVar31);
          *(undefined1 (*) [64])((long)pvVar16 + uVar11 * 4) = auVar1;
          uVar11 = uVar11 + 0x10;
          auVar31 = vpaddd_avx512f(auVar31,auVar27);
        } while ((lVar7 + 0xfU & 0xfffffffffffffff0) != uVar11);
        lVar12 = 0;
        lVar14 = lVar7;
        pvVar21 = pvVar16;
        do {
          lVar13 = lVar12 + 1;
          if (lVar13 < lVar7) {
            lVar20 = 1;
            do {
              if (iVar3 == 1) {
                iVar17 = *(int *)((long)pvVar21 + lVar20 * 4);
                iVar22 = *(int *)((long)pvVar9 + lVar12 * 4 + lVar18);
                if (*(float *)((long)pvVar8 + (long)iVar22 * 4 + lVar19) <
                    *(float *)((long)pvVar8 + (long)iVar17 * 4 + lVar19)) {
LAB_00143bdf:
                  *(int *)((long)pvVar9 + lVar12 * 4 + lVar18) = iVar17;
                  *(int *)((long)pvVar21 + lVar20 * 4) = iVar22;
                }
              }
              else if (iVar3 == 0) {
                iVar22 = *(int *)((long)pvVar9 + lVar12 * 4 + lVar18);
                iVar17 = *(int *)((long)pvVar21 + lVar20 * 4);
                if (*(float *)((long)pvVar8 + (long)iVar17 * 4 + lVar19) <
                    *(float *)((long)pvVar8 + (long)iVar22 * 4 + lVar19)) goto LAB_00143bdf;
              }
              lVar20 = lVar20 + 1;
            } while (lVar14 != lVar20);
          }
          pvVar21 = (void *)((long)pvVar21 + 4);
          lVar14 = lVar14 + -1;
          lVar12 = lVar13;
        } while (lVar13 != lVar7);
      }
      lVar15 = lVar15 + iVar2;
      pvVar16 = (void *)((long)pvVar16 + sVar6 * (long)iVar2);
    } while (lVar15 < lVar10);
  }
  return;
}

Assistant:

void ggml_compute_forward_argsort(
    const ggml_compute_params * params,
    ggml_tensor * dst) {

    const ggml_tensor * src0 = dst->src[0];

    switch (src0->type) {
        case GGML_TYPE_F32:
            {
                ggml_compute_forward_argsort_f32(params, dst);
            } break;
        default:
            {
                GGML_ABORT("fatal error");
            }
    }
}